

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::WeakFulfillerBase::disposeImpl(WeakFulfillerBase *this,void *pointer)

{
  PromiseRejector *pPVar1;
  StringPtr defaultDescription;
  int iVar2;
  Exception local_1a8;
  
  if (this->inner != (PromiseRejector *)0x0) {
    iVar2 = (*this->inner->_vptr_PromiseRejector[1])();
    if ((char)iVar2 != '\0') {
      pPVar1 = this->inner;
      defaultDescription.content.size_ = 0x3f;
      defaultDescription.content.ptr =
           "PromiseFulfiller was destroyed without fulfilling the promise.";
      getDestructionReason
                (&local_1a8,END_FULFILLER_STACK_START_LISTENER_STACK,FAILED,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0xc40,defaultDescription);
      (**pPVar1->_vptr_PromiseRejector)(pPVar1,&local_1a8);
      Exception::~Exception(&local_1a8);
    }
    this->inner = (PromiseRejector *)0x0;
    return;
  }
  (*(this->super_Disposer)._vptr_Disposer[2])(this);
  return;
}

Assistant:

void WeakFulfillerBase::disposeImpl(void* pointer) const {
  if (inner == nullptr) {
    // Already detached.
    delete this;
  } else {
    if (inner->isWaiting()) {
      // Let's find out if there's an exception being thrown. If so, we'll use it to reject the
      // promise.
      inner->reject(getDestructionReason(
          reinterpret_cast<void*>(&END_FULFILLER_STACK_START_LISTENER_STACK),
          kj::Exception::Type::FAILED, __FILE__, __LINE__,
          "PromiseFulfiller was destroyed without fulfilling the promise."_kj));
    }
    inner = nullptr;
  }
}